

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall
Memory::HeapInfo::TransferPendingHeapBlocks(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x5a0,"(!recyclerSweep.IsBackground())","!recyclerSweep.IsBackground()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  VerifySmallHeapBlockCount(this);
  bVar2 = RecyclerSweep::HasPendingEmptyBlocks(recyclerSweep);
  if (bVar2) {
    for (lVar4 = 0x78; lVar4 != 0xa878; lVar4 = lVar4 + 0x380) {
      HeapBucketGroup<SmallAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
                ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
                 ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
                 lVar4),recyclerSweep);
    }
    for (lVar4 = 0xa878; lVar4 != 0x10df8; lVar4 = lVar4 + 0x380) {
      HeapBucketGroup<MediumAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
                ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
                 ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
                 lVar4),recyclerSweep);
    }
    VerifySmallHeapBlockCount(this);
  }
  RecyclerSweep::FlushPendingTransferDisposedObjects(recyclerSweep);
  return;
}

Assistant:

void
HeapInfo::TransferPendingHeapBlocks(RecyclerSweep& recyclerSweep)
{
    Assert(!recyclerSweep.IsBackground());
    RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
    if (recyclerSweep.HasPendingEmptyBlocks())
    {
        for (uint i = 0; i < HeapConstants::BucketCount; i++)
        {
            heapBuckets[i].TransferPendingEmptyHeapBlocks(recyclerSweep);
        }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
        for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
        {
            mediumHeapBuckets[i].TransferPendingEmptyHeapBlocks(recyclerSweep);
        }
#endif

        RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
    }

    // We might still have block that has been disposed but not made allocable
    // which happens if we finish disposing object during concurrent sweep
    // and can't modify the block lists
    recyclerSweep.FlushPendingTransferDisposedObjects();
}